

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t pbrt::Hash<float,pbrt::Point2<float>>(float args,Point2<float> args_1)

{
  undefined8 uVar1;
  uint64_t uVar2;
  undefined1 in_ZMM1 [64];
  uint64_t buf [2];
  size_t n;
  size_t sz;
  char *in_stack_ffffffffffffffc8;
  Point2<float> in_stack_ffffffffffffffd0;
  
  uVar1 = vmovlpd_avx(in_ZMM1._0_16_);
  hashRecursiveCopy<float,pbrt::Point2<float>>
            (in_stack_ffffffffffffffc8,(float)((ulong)uVar1 >> 0x20),in_stack_ffffffffffffffd0);
  uVar2 = MurmurHash64A(&stack0xffffffffffffffc8,0xc,0);
  return uVar2;
}

Assistant:

PBRT_CPU_GPU inline uint64_t Hash(Args... args) {
    // C++, you never cease to amaze: https://stackoverflow.com/a/57246704
    constexpr size_t sz = (sizeof(Args) + ... + 0);
    constexpr size_t n = (sz + 7) / 8;
    uint64_t buf[n];
    hashRecursiveCopy((char *)buf, args...);
    return MurmurHash64A((const unsigned char *)buf, sz, 0);
}